

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcherHelper::dispatchEvent(EventDispatcherHelper *this,Event *ev)

{
  Id IVar1;
  EventAgent *pEVar2;
  EventAgent *agent;
  undefined1 local_30 [8];
  AutoLock _auto_lock_;
  Event *ev_local;
  EventDispatcherHelper *this_local;
  
  _auto_lock_._16_8_ = ev;
  AutoLock::AutoLock((AutoLock *)local_30,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x3b);
  if (_auto_lock_._16_8_ == 0) {
    jh_log_print(2,"void EventDispatcherHelper::dispatchEvent(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0x3f,"Attempt to dispatch NULL event");
  }
  else {
    IVar1 = Event::getEventId((Event *)_auto_lock_._16_8_);
    if (IVar1 == -5) {
      pEVar2 = event_cast<EventAgent>((Event *)_auto_lock_._16_8_);
      if (pEVar2 != (EventAgent *)0x0) {
        (*(pEVar2->super_Event).super_RefCount._vptr_RefCount[3])();
      }
    }
    else {
      lookupListeners(this,(Event *)_auto_lock_._16_8_);
    }
  }
  AutoLock::~AutoLock((AutoLock *)local_30);
  return;
}

Assistant:

void EventDispatcherHelper::dispatchEvent( Event *ev )
{	
	DebugAutoLock( mLock );
	
	if ( ev == NULL )
	{
		LOG_WARN( "Attempt to dispatch NULL event" );
		return;
	}
	
	if ( ev->getEventId() == Event::kAgentEventId )
	{
		EventAgent *agent = event_cast<EventAgent>( ev );
		if ( agent != NULL )
			agent->deliver();
	}
	else
	{
		lookupListeners( ev );
	}
}